

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O1

IEnumerableCore<linq::DistinctState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:177:13),_int>_>
* __thiscall
linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::
Distinct(IEnumerableCore<linq::DistinctState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:177:13),_int>_>
         *__return_storage_ptr__,
        IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>
        *this)

{
  anon_class_1_0_00000001_for_transformer f;
  anon_class_1_0_00000001_for_transformer local_99;
  DistinctState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:177:13),_int>
  local_98;
  
  DistinctState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:177:13),_int>
  ::DistinctState(&local_98,&this->source,&local_99);
  IEnumerableCore<linq::DistinctState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:177:13),_int>_>
  ::IEnumerableCore(__return_storage_ptr__,&local_98);
  local_98.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_001581b0;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_98.previous._M_t);
  local_98.source.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00158168;
  local_98.source.source2.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00157b88;
  if (local_98.source.source2.state.
      super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.source.source2.state.
               super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_98.source.source1.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00157b88;
  if (local_98.source.source1.state.
      super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.source.source1.state.
               super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

decltype(auto) Distinct()
		{
			auto f = [](T x) { return x; };
			using F = decltype(f);
			return IEnumerableCore<DistinctState<S, F, T>>(DistinctState<S, F, T>(std::move(source), f));
		}